

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

RectMatrix<double,_3U,_3U> *
OpenMD::operator*(RectMatrix<double,_3U,_3U> *m1,RectMatrix<double,_3U,_3U> *m2)

{
  double *pdVar1;
  RectMatrix<double,_3U,_3U> *in_RDX;
  RectMatrix<double,_3U,_3U> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  double dVar2;
  double dVar3;
  uint k;
  uint j;
  uint i;
  RectMatrix<double,_3U,_3U> *result;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  
  RectMatrix<double,_3U,_3U>::RectMatrix(in_RDI);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        dVar2 = RectMatrix<double,_3U,_3U>::operator()(in_RSI,local_20,local_28);
        dVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RDX,local_28,local_24);
        pdVar1 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_20,local_24);
        *pdVar1 = dVar2 * dVar3 + *pdVar1;
      }
    }
  }
  return in_RDI;
}

Assistant:

inline RectMatrix<Real, Row, Col> operator*(
      const RectMatrix<Real, Row, SameDim>& m1,
      const RectMatrix<Real, SameDim, Col>& m2) {
    RectMatrix<Real, Row, Col> result;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        for (unsigned int k = 0; k < SameDim; k++)
          result(i, j) += m1(i, k) * m2(k, j);

    return result;
  }